

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcNames.c
# Opt level: O2

void Abc_NtkTransferNameIds(Abc_Ntk_t *p,Abc_Ntk_t *pNew)

{
  long lVar1;
  int iVar2;
  Vec_Int_t *pVVar3;
  Abc_Obj_t *pAVar4;
  long *plVar5;
  uint uVar6;
  int i;
  
  if (p->vNameIds == (Vec_Int_t *)0x0) {
    __assert_fail("p->vNameIds != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abcNames.c"
                  ,0x2d8,"void Abc_NtkTransferNameIds(Abc_Ntk_t *, Abc_Ntk_t *)");
  }
  if (pNew->vNameIds == (Vec_Int_t *)0x0) {
    pVVar3 = Vec_IntStart(pNew->vObjs->nSize);
    pNew->vNameIds = pVVar3;
    i = 0;
    do {
      if (p->vObjs->nSize <= i) {
        return;
      }
      pAVar4 = Abc_NtkObj(p,i);
      if (((pAVar4 != (Abc_Obj_t *)0x0) && ((pAVar4->field_6).pTemp != (void *)0x0)) &&
         (i < p->vNameIds->nSize)) {
        iVar2 = Vec_IntEntry(p->vNameIds,i);
        if (iVar2 != 0) {
          plVar5 = (long *)((ulong)(pAVar4->field_6).pTemp & 0xfffffffffffffffe);
          if ((Abc_Ntk_t *)*plVar5 != pNew) {
            __assert_fail("Abc_ObjNtk(pObjNew) == pNew",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abcNames.c"
                          ,0x2e2,"void Abc_NtkTransferNameIds(Abc_Ntk_t *, Abc_Ntk_t *)");
          }
          uVar6 = *(uint *)((long)plVar5 + 0x14) & 0xf;
          if (((uVar6 != 5) && (uVar6 != 2)) ||
             ((uVar6 = *(uint *)&pAVar4->field_0x14 & 0xf, uVar6 == 5 || (uVar6 == 2)))) {
            pVVar3 = pNew->vNameIds;
            lVar1 = plVar5[2];
            uVar6 = Vec_IntEntry(p->vNameIds,i);
            Vec_IntWriteEntry(pVVar3,(int)lVar1,(pAVar4->field_6).iTemp & 1U ^ uVar6);
          }
        }
      }
      i = i + 1;
    } while( true );
  }
  __assert_fail("pNew->vNameIds == NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abcNames.c"
                ,0x2d9,"void Abc_NtkTransferNameIds(Abc_Ntk_t *, Abc_Ntk_t *)");
}

Assistant:

void Abc_NtkTransferNameIds( Abc_Ntk_t * p, Abc_Ntk_t * pNew )
{
    Abc_Obj_t * pObj, * pObjNew;
    int i;
    assert( p->vNameIds != NULL );
    assert( pNew->vNameIds == NULL );
    pNew->vNameIds = Vec_IntStart( Abc_NtkObjNumMax(pNew) );
//    Abc_NtkForEachCi( p, pObj, i )
//        printf( "%d ", Vec_IntEntry(p->vNameIds, Abc_ObjId(pObj)) );
//    printf( "\n" );
    Abc_NtkForEachObj( p, pObj, i )
        if ( pObj->pCopy && i < Vec_IntSize(p->vNameIds) && Vec_IntEntry(p->vNameIds, i) )
        {
            pObjNew = Abc_ObjRegular(pObj->pCopy);
            assert( Abc_ObjNtk(pObjNew) == pNew );
            if ( Abc_ObjIsCi(pObjNew) && !Abc_ObjIsCi(pObj) ) // do not overwrite CI name by internal node name
                continue;
            Vec_IntWriteEntry( pNew->vNameIds, Abc_ObjId(pObjNew), Vec_IntEntry(p->vNameIds, i) ^ Abc_ObjIsComplement(pObj->pCopy) );
        }
}